

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O2

bool __thiscall higan::HttpResponse::SetFileToResponse(HttpResponse *this,string *file_path)

{
  bool bVar1;
  FileStatus FVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::make_shared<higan::FileForRead,std::__cxx11::string_const&>(&local_50);
  std::__shared_ptr<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->file_ptr_).super___shared_ptr<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
  FVar2 = FileForRead::GetFileStatus
                    ((this->file_ptr_).
                     super___shared_ptr<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  bVar1 = true;
  if (FVar2 != OPEN_SUCCESS) {
    if (FVar2 == IS_DIR) {
      std::operator+(&local_50,file_path,"/index.html");
      bVar1 = SetFileToResponse(this,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar1) {
        return true;
      }
    }
    std::__shared_ptr<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->file_ptr_).super___shared_ptr<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2>
              );
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool HttpResponse::SetFileToResponse(const std::string& file_path)
{
	file_ptr_ = std::make_shared<FileForRead>(file_path);

	bool add_ok_result = false;

	switch (file_ptr_->GetFileStatus())
	{
		case FileForRead::FileStatus::NOT_EXIST:
			add_ok_result = false;
			break;
		case FileForRead::FileStatus::IS_DIR:
			add_ok_result = SetFileToResponse(file_path + "/index.html");
			break;
		case FileForRead::FileStatus::OPEN_SUCCESS:
			add_ok_result = true;
			break;
		case FileForRead::FileStatus::OPEN_ERROR:
			add_ok_result = false;
			break;
	}

	if (!add_ok_result)
	{
		file_ptr_.reset();
	}
	return add_ok_result;
}